

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxEpsRefine.h
# Opt level: O2

dfa_t * __thiscall
covenant::MaxEpsRefine<covenant::Sym>::refine
          (dfa_t *__return_storage_ptr__,MaxEpsRefine<covenant::Sym> *this,cond_eps_gen_t *gen)

{
  State __fd;
  socklen_t *in_RCX;
  sockaddr *__addr;
  dfa_t *dfa;
  TermFactory local_20;
  
  if ((gen->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (gen->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_20.px = (gen->_tfac).px;
    local_20.pn.pi_ = (gen->_tfac).pn.pi_;
    if (local_20.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_20.pn.pi_)->use_count_ = (local_20.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    DFA<covenant::Sym>::DFA(__return_storage_ptr__,&local_20);
    boost::detail::shared_count::~shared_count(&local_20.pn);
    __fd = DFA<covenant::Sym>::state(__return_storage_ptr__,0);
    __return_storage_ptr__->start = __fd.id;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,__fd.id,__addr,in_RCX);
  }
  else {
    maximum_refinement(__return_storage_ptr__,this,gen,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

dfa_t refine(cond_eps_gen_t& gen) 
    {
      if(gen.word.size() == 0)
      {
        // Just give an empty automaton.
        dfa_t dfa (gen.getTermFactory ());
        State q0 = dfa.state(0);
        dfa.setStart(q0);
        dfa.accept(q0);
        return dfa;
      }
      return maximum_refinement(gen, 0, 0);
    }